

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan,false,false,true,true>
                (string_t *ldata,string_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  sel_t sVar6;
  ulong uVar7;
  string_t *psVar8;
  string_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  long lVar15;
  
  if (count + 0x3f < 0x40) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    lVar15 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar12 = uVar7;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
LAB_0043219a:
        if (uVar7 < uVar11) {
          psVar8 = rdata + uVar7;
          psVar9 = ldata + uVar7;
          do {
            uVar12 = uVar7;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar12 = (ulong)sel->sel_vector[uVar7];
            }
            bVar5 = string_t::StringComparisonOperators::GreaterThan(psVar9,psVar8);
            true_sel->sel_vector[iVar14] = (sel_t)uVar12;
            iVar14 = iVar14 + bVar5;
            false_sel->sel_vector[lVar15] = (sel_t)uVar12;
            lVar15 = lVar15 + (ulong)!bVar5;
            uVar7 = uVar7 + 1;
            psVar8 = psVar8 + 1;
            psVar9 = psVar9 + 1;
            uVar12 = uVar11;
          } while (uVar11 != uVar7);
        }
      }
      else {
        uVar2 = puVar1[uVar10];
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0043219a;
        if (uVar2 == 0) {
          uVar12 = uVar11;
          if (uVar7 < uVar11) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar6 = (sel_t)uVar7;
              if (psVar3 != (sel_t *)0x0) {
                sVar6 = psVar3[uVar7];
              }
              psVar4[lVar15] = sVar6;
              lVar15 = lVar15 + 1;
              uVar7 = uVar7 + 1;
            } while (uVar11 != uVar7);
          }
        }
        else if (uVar7 < uVar11) {
          psVar8 = rdata + uVar7;
          psVar9 = ldata + uVar7;
          uVar13 = 0;
          do {
            if (sel->sel_vector == (sel_t *)0x0) {
              sVar6 = (int)uVar7 + (int)uVar13;
            }
            else {
              sVar6 = sel->sel_vector[uVar7 + uVar13];
            }
            if ((uVar2 >> (uVar13 & 0x3f) & 1) == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = string_t::StringComparisonOperators::GreaterThan(psVar9,psVar8);
            }
            true_sel->sel_vector[iVar14] = sVar6;
            iVar14 = iVar14 + bVar5;
            false_sel->sel_vector[lVar15] = sVar6;
            lVar15 = lVar15 + (ulong)(bVar5 ^ 1);
            uVar13 = uVar13 + 1;
            psVar8 = psVar8 + 1;
            psVar9 = psVar9 + 1;
            uVar12 = uVar11;
          } while (uVar11 - uVar7 != uVar13);
        }
      }
      uVar7 = uVar12;
      uVar10 = uVar10 + 1;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return iVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}